

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

void __thiscall btCollisionWorldImporter::~btCollisionWorldImporter(btCollisionWorldImporter *this)

{
  this->_vptr_btCollisionWorldImporter = (_func_int **)&PTR__btCollisionWorldImporter_0021bea8;
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&(this->m_bodyMap).m_keyArray);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray(&(this->m_bodyMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_bodyMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_bodyMap).m_hashTable);
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&(this->m_shapeMap).m_keyArray);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&(this->m_shapeMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_shapeMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_shapeMap).m_hashTable);
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&(this->m_objectNameMap).m_keyArray);
  btAlignedObjectArray<const_char_*>::~btAlignedObjectArray(&(this->m_objectNameMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_objectNameMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_objectNameMap).m_hashTable);
  btAlignedObjectArray<btHashString>::~btAlignedObjectArray(&(this->m_nameColObjMap).m_keyArray);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            (&(this->m_nameColObjMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_nameColObjMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_nameColObjMap).m_hashTable);
  btAlignedObjectArray<btHashString>::~btAlignedObjectArray(&(this->m_nameShapeMap).m_keyArray);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray
            (&(this->m_nameShapeMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_nameShapeMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_nameShapeMap).m_hashTable);
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&(this->m_timMap).m_keyArray);
  btAlignedObjectArray<btTriangleInfoMap_*>::~btAlignedObjectArray(&(this->m_timMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_timMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_timMap).m_hashTable);
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&(this->m_bvhMap).m_keyArray);
  btAlignedObjectArray<btOptimizedBvh_*>::~btAlignedObjectArray(&(this->m_bvhMap).m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_bvhMap).m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&(this->m_bvhMap).m_hashTable);
  btAlignedObjectArray<btVector3DoubleData_*>::~btAlignedObjectArray(&this->m_doubleVertexArrays);
  btAlignedObjectArray<btVector3FloatData_*>::~btAlignedObjectArray(&this->m_floatVertexArrays);
  btAlignedObjectArray<unsigned_char_*>::~btAlignedObjectArray(&this->m_charIndexArrays);
  btAlignedObjectArray<short_*>::~btAlignedObjectArray(&this->m_shortIndexArrays);
  btAlignedObjectArray<int_*>::~btAlignedObjectArray(&this->m_indexArrays);
  btAlignedObjectArray<char_*>::~btAlignedObjectArray(&this->m_allocatedNames);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            (&this->m_allocatedCollisionObjects);
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::~btAlignedObjectArray
            (&this->m_allocatedbtStridingMeshInterfaceDatas);
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::~btAlignedObjectArray
            (&this->m_allocatedTriangleIndexArrays);
  btAlignedObjectArray<btTriangleInfoMap_*>::~btAlignedObjectArray
            (&this->m_allocatedTriangleInfoMaps);
  btAlignedObjectArray<btOptimizedBvh_*>::~btAlignedObjectArray(&this->m_allocatedBvhs);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray(&this->m_allocatedRigidBodies);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&this->m_allocatedCollisionShapes)
  ;
  return;
}

Assistant:

btCollisionWorldImporter::~btCollisionWorldImporter()
{
}